

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution1d.cpp
# Opt level: O2

float __thiscall embree::Distribution1D::sample(Distribution1D *this,float u)

{
  pointer pfVar1;
  uint uVar2;
  float *pfVar3;
  uint uVar4;
  float fVar5;
  undefined1 auVar6 [16];
  
  pfVar1 = (this->CDF).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar3 = std::__upper_bound<float_const*,float,__gnu_cxx::__ops::_Val_less_iter>
                     (pfVar1,pfVar1 + this->size);
  pfVar1 = (this->CDF).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (int)((ulong)((long)pfVar3 - (long)pfVar1) >> 2) - 1;
  uVar4 = (int)this->size - 1;
  if ((int)uVar2 < (int)uVar4) {
    uVar4 = uVar2;
  }
  uVar2 = 0;
  if (0 < (int)uVar4) {
    uVar2 = uVar4;
  }
  fVar5 = pfVar1[(ulong)uVar2 + 1] - pfVar1[uVar2];
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    auVar6 = rcpss(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
    fVar5 = (float)(int)uVar2 + (2.0 - fVar5 * auVar6._0_4_) * auVar6._0_4_ * (u - pfVar1[uVar2]);
  }
  else {
    fVar5 = (float)(int)uVar2;
  }
  return fVar5;
}

Assistant:

float Distribution1D::sample(const float u) const
  {
    /*! coarse sampling of the distribution */
    const float* pointer = std::upper_bound(CDF.data(), CDF.data()+size, u);
    int index = clamp(int(pointer-CDF.data()-1),0,int(size)-1);

    /*! refine sampling linearly by assuming the distribution being a step function */
    const float dCDF = CDF[index+1] - CDF[index];
    if (dCDF == 0.0f) return float(index);
    float fraction = (u - CDF[index]) * rcp(dCDF);
    return float(index)+fraction;
  }